

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::register_custom_layer(Net *this,int index,layer_creator_func creator)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  value_type *in_RDX;
  uint in_ESI;
  vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_> *in_RDI;
  layer_registry_entry dummy;
  int custom_index;
  undefined4 in_stack_ffffffffffffffe8;
  vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_> *this_00;
  int local_4;
  
  uVar1 = in_ESI & 0xfffffeff;
  if (in_ESI == uVar1) {
    fprintf(_stderr,"can not register build-in layer index %d\n",(ulong)uVar1);
    local_4 = -1;
  }
  else {
    this_00 = in_RDI;
    sVar2 = std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::
            size((vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_> *)
                 &in_RDI[3].
                  super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((int)sVar2 <= (int)uVar1) {
      std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::resize
                (this_00,CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
    }
    pvVar3 = std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::
             operator[]((vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                         *)&in_RDI[3].
                            super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)uVar1);
    if (pvVar3->creator != (layer_creator_func)0x0) {
      fprintf(_stderr,"overwrite existing custom layer index %d\n",(ulong)uVar1);
    }
    pvVar3 = std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::
             operator[]((vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                         *)&in_RDI[3].
                            super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)uVar1);
    pvVar3->creator = (layer_creator_func)in_RDX;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Net::register_custom_layer(int index, layer_creator_func creator)
{
    int custom_index = index & ~LayerType::CustomBit;
    if (index == custom_index)
    {
        fprintf(stderr, "can not register build-in layer index %d\n", custom_index);
        return -1;
    }

    if ((int)custom_layer_registry.size() <= custom_index)
    {
#if NCNN_STRING
        struct layer_registry_entry dummy = { "", 0 };
#else
        struct layer_registry_entry dummy = { 0 };
#endif // NCNN_STRING
        custom_layer_registry.resize(custom_index + 1, dummy);
    }

    if (custom_layer_registry[custom_index].creator)
    {
        fprintf(stderr, "overwrite existing custom layer index %d\n", custom_index);
    }

    custom_layer_registry[custom_index].creator = creator;
    return 0;
}